

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ImmediateBrokenPromiseNode::get(ImmediateBrokenPromiseNode *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  
  if ((output->exception).ptr.isSet == true) {
    (output->exception).ptr.isSet = false;
    Exception::~Exception(&(output->exception).ptr.field_1.value);
  }
  (output->exception).ptr.field_1.value.ownFile.content.ptr = (this->exception).ownFile.content.ptr;
  (output->exception).ptr.field_1.value.ownFile.content.size_ =
       (this->exception).ownFile.content.size_;
  (output->exception).ptr.field_1.value.ownFile.content.disposer =
       (this->exception).ownFile.content.disposer;
  (this->exception).ownFile.content.ptr = (char *)0x0;
  (this->exception).ownFile.content.size_ = 0;
  uVar1 = *(undefined8 *)&(this->exception).line;
  (output->exception).ptr.field_1.value.file = (this->exception).file;
  *(undefined8 *)((long)&(output->exception).ptr.field_1 + 0x20) = uVar1;
  (output->exception).ptr.field_1.value.description.content.ptr =
       (this->exception).description.content.ptr;
  (output->exception).ptr.field_1.value.description.content.size_ =
       (this->exception).description.content.size_;
  (output->exception).ptr.field_1.value.description.content.disposer =
       (this->exception).description.content.disposer;
  (this->exception).description.content.ptr = (char *)0x0;
  (this->exception).description.content.size_ = 0;
  (output->exception).ptr.field_1.value.context.ptr.disposer =
       (this->exception).context.ptr.disposer;
  (output->exception).ptr.field_1.value.context.ptr.ptr = (this->exception).context.ptr.ptr;
  (this->exception).context.ptr.ptr = (Context *)0x0;
  memcpy((void *)((long)&(output->exception).ptr.field_1 + 0x50),(this->exception).trace,0x104);
  (output->exception).ptr.isSet = true;
  return;
}

Assistant:

void ImmediateBrokenPromiseNode::get(ExceptionOrValue& output) noexcept {
  output.exception = kj::mv(exception);
}